

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uuid.cpp
# Opt level: O1

void __thiscall Uuid_Bad_Test::~Uuid_Bad_Test(Uuid_Bad_Test *this)

{
  (this->super_Uuid).super_Test._vptr_Test = (_func_int **)&PTR__Uuid_00242188;
  pstore::database::~database(&(this->super_Uuid).db_);
  in_memory_store::~in_memory_store(&(this->super_Uuid).db_storage_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (Uuid, Bad) {
    pstore::uuid id;
    auto parser = make_json_uuid_parser (&id);
    parser.input (R"("bad")"s).eof ();
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::bad_uuid));
}